

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

int xmlParseBalancedChunkMemoryRecover
              (xmlDocPtr doc,xmlSAXHandlerPtr sax,void *user_data,int depth,xmlChar *string,
              xmlNodePtr *lst,int recover)

{
  _xmlNode *p_Var1;
  int size_00;
  xmlParserCtxtPtr ctxt_00;
  xmlDocPtr doc_00;
  xmlChar *pxVar2;
  xmlNodePtr cur_00;
  xmlNodePtr local_78;
  xmlNodePtr cur;
  int ret;
  int size;
  xmlNodePtr newRoot;
  xmlNodePtr content;
  xmlSAXHandlerPtr oldsax;
  xmlDocPtr newDoc;
  xmlParserCtxtPtr ctxt;
  xmlNodePtr *lst_local;
  xmlChar *string_local;
  int depth_local;
  void *user_data_local;
  xmlSAXHandlerPtr sax_local;
  xmlDocPtr doc_local;
  
  content = (xmlNodePtr)0x0;
  if (depth < 0x29) {
    if (lst != (xmlNodePtr *)0x0) {
      *lst = (xmlNodePtr)0x0;
    }
    if (string == (xmlChar *)0x0) {
      doc_local._4_4_ = -1;
    }
    else {
      size_00 = xmlStrlen(string);
      ctxt_00 = xmlCreateMemoryParserCtxt((char *)string,size_00);
      if (ctxt_00 == (xmlParserCtxtPtr)0x0) {
        doc_local._4_4_ = -1;
      }
      else {
        ctxt_00->userData = ctxt_00;
        if (sax != (xmlSAXHandlerPtr)0x0) {
          content = (xmlNodePtr)ctxt_00->sax;
          ctxt_00->sax = sax;
          if (user_data != (void *)0x0) {
            ctxt_00->userData = user_data;
          }
        }
        doc_00 = xmlNewDoc("1.0");
        if (doc_00 == (xmlDocPtr)0x0) {
          xmlFreeParserCtxt(ctxt_00);
          doc_local._4_4_ = -1;
        }
        else {
          doc_00->properties = 0x40;
          if ((doc == (xmlDocPtr)0x0) || (doc->dict == (_xmlDict *)0x0)) {
            xmlCtxtUseOptionsInternal(ctxt_00,0x1000,(char *)0x0);
          }
          else {
            xmlDictFree(ctxt_00->dict);
            ctxt_00->dict = doc->dict;
            xmlDictReference(ctxt_00->dict);
            pxVar2 = xmlDictLookup(ctxt_00->dict,"xml",3);
            ctxt_00->str_xml = pxVar2;
            pxVar2 = xmlDictLookup(ctxt_00->dict,"xmlns",5);
            ctxt_00->str_xmlns = pxVar2;
            pxVar2 = xmlDictLookup(ctxt_00->dict,(xmlChar *)"http://www.w3.org/XML/1998/namespace",
                                   0x24);
            ctxt_00->str_xml_ns = pxVar2;
            ctxt_00->dictNames = 1;
          }
          if (doc != (xmlDocPtr)0x0) {
            doc_00->intSubset = doc->intSubset;
            doc_00->extSubset = doc->extSubset;
          }
          cur_00 = xmlNewDocNode(doc_00,(xmlNsPtr)0x0,(xmlChar *)"pseudoroot",(xmlChar *)0x0);
          if (cur_00 == (xmlNodePtr)0x0) {
            if (sax != (xmlSAXHandlerPtr)0x0) {
              ctxt_00->sax = (_xmlSAXHandler *)content;
            }
            xmlFreeParserCtxt(ctxt_00);
            doc_00->intSubset = (_xmlDtd *)0x0;
            doc_00->extSubset = (_xmlDtd *)0x0;
            xmlFreeDoc(doc_00);
            doc_local._4_4_ = -1;
          }
          else {
            xmlAddChild((xmlNodePtr)doc_00,cur_00);
            nodePush(ctxt_00,cur_00);
            if (doc == (xmlDocPtr)0x0) {
              ctxt_00->myDoc = doc_00;
            }
            else {
              ctxt_00->myDoc = doc_00;
              doc_00->children->doc = doc;
              xmlSearchNsByHref(doc,(xmlNodePtr)doc,
                                (xmlChar *)"http://www.w3.org/XML/1998/namespace");
              doc_00->oldNs = doc->oldNs;
            }
            ctxt_00->instate = XML_PARSER_CONTENT;
            ctxt_00->input_id = 2;
            ctxt_00->depth = depth;
            ctxt_00->validate = 0;
            ctxt_00->loadsubset = 0;
            xmlDetectSAX2(ctxt_00);
            if (doc == (xmlDocPtr)0x0) {
              xmlParseContent(ctxt_00);
            }
            else {
              p_Var1 = doc->children;
              doc->children = (_xmlNode *)0x0;
              xmlParseContent(ctxt_00);
              doc->children = p_Var1;
            }
            if ((*ctxt_00->input->cur == '<') && (ctxt_00->input->cur[1] == '/')) {
              xmlFatalErr(ctxt_00,XML_ERR_NOT_WELL_BALANCED,(char *)0x0);
            }
            else if (*ctxt_00->input->cur != '\0') {
              xmlFatalErr(ctxt_00,XML_ERR_EXTRA_CONTENT,(char *)0x0);
            }
            if (ctxt_00->node != doc_00->children) {
              xmlFatalErr(ctxt_00,XML_ERR_NOT_WELL_BALANCED,(char *)0x0);
            }
            if (ctxt_00->wellFormed == 0) {
              if (ctxt_00->errNo == 0) {
                cur._0_4_ = 1;
              }
              else {
                cur._0_4_ = ctxt_00->errNo;
              }
            }
            else {
              cur._0_4_ = 0;
            }
            if ((lst != (xmlNodePtr *)0x0) && (((int)cur == 0 || (recover == 1)))) {
              local_78 = doc_00->children->children;
              *lst = local_78;
              for (; local_78 != (xmlNodePtr)0x0; local_78 = local_78->next) {
                xmlSetTreeDoc(local_78,doc);
                local_78->parent = (_xmlNode *)0x0;
              }
              doc_00->children->children = (_xmlNode *)0x0;
            }
            if (sax != (xmlSAXHandlerPtr)0x0) {
              ctxt_00->sax = (_xmlSAXHandler *)content;
            }
            xmlFreeParserCtxt(ctxt_00);
            doc_00->intSubset = (_xmlDtd *)0x0;
            doc_00->extSubset = (_xmlDtd *)0x0;
            doc_00->oldNs = (_xmlNs *)0x0;
            xmlFreeDoc(doc_00);
            doc_local._4_4_ = (int)cur;
          }
        }
      }
    }
  }
  else {
    doc_local._4_4_ = 0x59;
  }
  return doc_local._4_4_;
}

Assistant:

int
xmlParseBalancedChunkMemoryRecover(xmlDocPtr doc, xmlSAXHandlerPtr sax,
     void *user_data, int depth, const xmlChar *string, xmlNodePtr *lst,
     int recover) {
    xmlParserCtxtPtr ctxt;
    xmlDocPtr newDoc;
    xmlSAXHandlerPtr oldsax = NULL;
    xmlNodePtr content, newRoot;
    int size;
    int ret = 0;

    if (depth > 40) {
	return(XML_ERR_ENTITY_LOOP);
    }


    if (lst != NULL)
        *lst = NULL;
    if (string == NULL)
        return(-1);

    size = xmlStrlen(string);

    ctxt = xmlCreateMemoryParserCtxt((char *) string, size);
    if (ctxt == NULL) return(-1);
    ctxt->userData = ctxt;
    if (sax != NULL) {
	oldsax = ctxt->sax;
        ctxt->sax = sax;
	if (user_data != NULL)
	    ctxt->userData = user_data;
    }
    newDoc = xmlNewDoc(BAD_CAST "1.0");
    if (newDoc == NULL) {
	xmlFreeParserCtxt(ctxt);
	return(-1);
    }
    newDoc->properties = XML_DOC_INTERNAL;
    if ((doc != NULL) && (doc->dict != NULL)) {
        xmlDictFree(ctxt->dict);
	ctxt->dict = doc->dict;
	xmlDictReference(ctxt->dict);
	ctxt->str_xml = xmlDictLookup(ctxt->dict, BAD_CAST "xml", 3);
	ctxt->str_xmlns = xmlDictLookup(ctxt->dict, BAD_CAST "xmlns", 5);
	ctxt->str_xml_ns = xmlDictLookup(ctxt->dict, XML_XML_NAMESPACE, 36);
	ctxt->dictNames = 1;
    } else {
	xmlCtxtUseOptionsInternal(ctxt, XML_PARSE_NODICT, NULL);
    }
    /* doc == NULL is only supported for historic reasons */
    if (doc != NULL) {
	newDoc->intSubset = doc->intSubset;
	newDoc->extSubset = doc->extSubset;
    }
    newRoot = xmlNewDocNode(newDoc, NULL, BAD_CAST "pseudoroot", NULL);
    if (newRoot == NULL) {
	if (sax != NULL)
	    ctxt->sax = oldsax;
	xmlFreeParserCtxt(ctxt);
	newDoc->intSubset = NULL;
	newDoc->extSubset = NULL;
        xmlFreeDoc(newDoc);
	return(-1);
    }
    xmlAddChild((xmlNodePtr) newDoc, newRoot);
    nodePush(ctxt, newRoot);
    /* doc == NULL is only supported for historic reasons */
    if (doc == NULL) {
	ctxt->myDoc = newDoc;
    } else {
	ctxt->myDoc = newDoc;
	newDoc->children->doc = doc;
	/* Ensure that doc has XML spec namespace */
	xmlSearchNsByHref(doc, (xmlNodePtr)doc, XML_XML_NAMESPACE);
	newDoc->oldNs = doc->oldNs;
    }
    ctxt->instate = XML_PARSER_CONTENT;
    ctxt->input_id = 2;
    ctxt->depth = depth;

    /*
     * Doing validity checking on chunk doesn't make sense
     */
    ctxt->validate = 0;
    ctxt->loadsubset = 0;
    xmlDetectSAX2(ctxt);

    if ( doc != NULL ){
        content = doc->children;
        doc->children = NULL;
        xmlParseContent(ctxt);
        doc->children = content;
    }
    else {
        xmlParseContent(ctxt);
    }
    if ((RAW == '<') && (NXT(1) == '/')) {
	xmlFatalErr(ctxt, XML_ERR_NOT_WELL_BALANCED, NULL);
    } else if (RAW != 0) {
	xmlFatalErr(ctxt, XML_ERR_EXTRA_CONTENT, NULL);
    }
    if (ctxt->node != newDoc->children) {
	xmlFatalErr(ctxt, XML_ERR_NOT_WELL_BALANCED, NULL);
    }

    if (!ctxt->wellFormed) {
        if (ctxt->errNo == 0)
	    ret = 1;
	else
	    ret = ctxt->errNo;
    } else {
      ret = 0;
    }

    if ((lst != NULL) && ((ret == 0) || (recover == 1))) {
	xmlNodePtr cur;

	/*
	 * Return the newly created nodeset after unlinking it from
	 * they pseudo parent.
	 */
	cur = newDoc->children->children;
	*lst = cur;
	while (cur != NULL) {
	    xmlSetTreeDoc(cur, doc);
	    cur->parent = NULL;
	    cur = cur->next;
	}
	newDoc->children->children = NULL;
    }

    if (sax != NULL)
	ctxt->sax = oldsax;
    xmlFreeParserCtxt(ctxt);
    newDoc->intSubset = NULL;
    newDoc->extSubset = NULL;
    /* This leaks the namespace list if doc == NULL */
    newDoc->oldNs = NULL;
    xmlFreeDoc(newDoc);

    return(ret);
}